

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_char<char,fmt::v10::appender>
                   (appender out,char value,format_specs<char> *specs)

{
  appender aVar1;
  format_specs<char> *in_RDX;
  undefined1 in_SIL;
  anon_class_2_2_bf5026b7 *in_RDI;
  bool is_debug;
  undefined7 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._7_1_ = in_SIL;
  aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_7_ =
       in_stack_ffffffffffffffe8;
  aVar1 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_>
                    (aVar1,in_RDX,CONCAT17(in_RDX->type == debug,in_stack_ffffffffffffffd8),in_RDI);
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write_char(OutputIt out, Char value,
                              const format_specs<Char>& specs) -> OutputIt {
  bool is_debug = specs.type == presentation_type::debug;
  return write_padded(out, specs, 1, [=](reserve_iterator<OutputIt> it) {
    if (is_debug) return write_escaped_char(it, value);
    *it++ = value;
    return it;
  });
}